

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connecion.cpp
# Opt level: O0

void __thiscall Markov::Connection::TrainFinal(Connection *this,string_view src,TrainData *td)

{
  char **ppcVar1;
  csub_match m;
  bool bVar2;
  const_iterator __a;
  const_iterator __b;
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)> *this_00;
  value_type *pvVar3;
  string_view __args;
  char *in_stack_fffffffffffffe60;
  regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> local_170;
  char *local_e8;
  char *pcStack_e0;
  undefined8 local_d8;
  string_view local_d0;
  undefined1 local_b0 [8];
  sviterator iter;
  TrainData *td_local;
  Connection *this_local;
  string_view src_local;
  
  src_local._M_len = (size_t)src._M_str;
  this_local = (Connection *)src._M_len;
  iter._128_8_ = td;
  __a = std::basic_string_view<char,_std::char_traits<char>_>::begin
                  ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  __b = std::basic_string_view<char,_std::char_traits<char>_>::end
                  ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  std::__cxx11::regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
  regex_token_iterator
            ((regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *)local_b0
             ,__a,__b,(regex_type *)iter._128_8_,0,0);
  while( true ) {
    bVar2 = std::__cxx11::
            regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::operator!=
                      ((regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>
                        *)local_b0,
                       (regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>
                        *)(iter._128_8_ + 0x108));
    if (!bVar2) break;
    this_00 = (function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)> *)
              (iter._128_8_ + 400);
    pvVar3 = std::__cxx11::
             regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::operator*
                       ((regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>
                         *)local_b0);
    local_d8 = *(undefined8 *)&pvVar3->matched;
    local_e8 = (pvVar3->super_pair<const_char_*,_const_char_*>).first;
    ppcVar1 = &(pvVar3->super_pair<const_char_*,_const_char_*>).second;
    pcStack_e0 = *ppcVar1;
    m._16_8_ = in_stack_fffffffffffffe60;
    m.super_pair<const_char_*,_const_char_*> = *(pair<const_char_*,_const_char_*> *)ppcVar1;
    __args = anon_unknown.dwarf_22748::matchToSv(m);
    in_stack_fffffffffffffe60 = __args._M_str;
    local_d0 = __args;
    std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>::operator()
              (this_00,__args,false);
    std::__cxx11::regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
    operator++(&local_170,
               (regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *)
               local_b0,0);
    std::__cxx11::regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
    ~regex_token_iterator(&local_170);
  }
  std::__cxx11::regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
  ~regex_token_iterator
            ((regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *)local_b0
            );
  return;
}

Assistant:

void Connection::TrainFinal(std::string_view src, const TrainData& td) {
		for (auto iter = sviterator(src.begin(), src.end(), td.iter); iter != td.badIter; iter++) {
				td.func(matchToSv(*iter), false);
				}
		}